

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  TemporaryBuffer *this_00;
  byte bVar1;
  byte *pbVar2;
  byte *last;
  undefined8 *puVar3;
  code *pcVar4;
  OLECHAR ch_00;
  BOOL BVar5;
  uint ch_01;
  int iVar6;
  undefined4 *puVar7;
  IdentPtr pIVar8;
  uint32 cch;
  char16 cVar9;
  uint uVar10;
  OLECHAR OVar11;
  HRESULT hr;
  char16_t *prgch;
  bool bVar12;
  char16 local_46;
  uint local_44;
  OLECHAR lower;
  byte *pbStack_40;
  int wT;
  char16 local_32 [4];
  OLECHAR ch;
  
  pbVar2 = *pp;
  last = *(byte **)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf3);
  *(undefined4 *)(this + 0x51c) = 0;
  this_00 = (TemporaryBuffer *)(this + 0x628);
  *(undefined4 *)(this + 0x634) = 0;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pbStack_40 = pbVar2;
LAB_00d56b7c:
  pbVar2 = pbStack_40 + 1;
  if (last <= pbStack_40) {
    local_32[0] = L'\0';
LAB_00d56bf4:
    if (last < pbVar2) {
      *(byte **)(this + 0x4e0) = pbStack_40;
      pbStack_40 = pbVar2;
      Scanner<UTF8EncodingPolicyBase<false>_>::Error
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
    }
    ch_00 = L'\0';
    goto LAB_00d56c00;
  }
  bVar1 = *pbStack_40;
  ch_00 = (OLECHAR)bVar1;
  local_32[0] = (char16)bVar1;
  if (bVar1 == 0) goto LAB_00d56bf4;
  if (bVar1 == 10) {
LAB_00d56d2d:
    pbStack_40 = pbVar2;
    Scanner<UTF8EncodingPolicyBase<false>_>::NotifyScannedNewLine
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)this);
    *(byte **)(this + 0x4d0) = pbStack_40;
    ch_00 = L'\n';
    pbVar2 = pbStack_40;
    goto LAB_00d56c00;
  }
  if (bVar1 == 0xd) {
    if ((pbVar2 < last) && (*pbVar2 == 10)) {
      pbVar2 = pbStack_40 + 2;
    }
    pbStack_40 = pbVar2;
    local_32[0] = L'\n';
    pbVar2 = pbStack_40;
    goto LAB_00d56d2d;
  }
  if (bVar1 == 0x22) {
LAB_00d56c21:
    pbStack_40 = pbVar2;
    if ((ushort)bVar1 != delim) goto LAB_00d56c00;
LAB_00d570de:
    if (((byte)this[0x508] & 0x40) == 0) {
      prgch = *(char16_t **)(this + 0x520);
      cch = *(uint32 *)(this + 0x51c);
LAB_00d570fe:
      puVar3 = *(undefined8 **)(this + 0x4b8);
      pIVar8 = HashTbl::PidHashNameLen<char16_t>((HashTbl *)(this + 0x20),prgch,cch);
      *puVar3 = pIVar8;
      puVar3[1] = 0;
    }
    else {
      if (*(int *)(this + 0x51c) == 10) {
        prgch = *(char16_t **)(this + 0x520);
        iVar6 = bcmp(L"use strict",prgch,0x14);
        if (iVar6 == 0) {
          cch = 10;
          goto LAB_00d570fe;
        }
      }
      puVar3 = *(undefined8 **)(this + 0x4b8);
      *puVar3 = 0;
      puVar3[1] = 0;
    }
    *(undefined4 *)(this + 0x744) = 0;
    this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)
                  ((byte)this[0x508] & 0xfd | (delim == L'\"') * '\x02');
    *pp = pbStack_40;
    return tkStrCon;
  }
  if (bVar1 == 0x24) {
    ch_00 = L'$';
    if ((last <= pbVar2) || (*pbVar2 != 0x7b)) goto LAB_00d56c00;
    goto LAB_00d570de;
  }
  if (bVar1 == 0x27) goto LAB_00d56c21;
  if (bVar1 != 0x5c) {
    if (bVar1 == 0x60) goto LAB_00d570de;
    if ((char)bVar1 < '\0') {
      pbStack_40 = pbVar2;
      local_32[0] = UTF8EncodingPolicyBase<false>::ReadRest<true>
                              ((UTF8EncodingPolicyBase<false> *)(this + 8),local_32[0],
                               &stack0xffffffffffffffc0,last);
      pbVar2 = pbStack_40;
      ch_00 = local_32[0];
    }
    goto LAB_00d56c00;
  }
  pbStack_40 = pbVar2;
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x5c);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] | 8);
  pbVar2 = pbStack_40 + 1;
  if (last <= pbStack_40) {
    local_32[0] = L'\0';
LAB_00d56d53:
    ch_00 = L'0';
    if (pbVar2 < last) goto LAB_00d56c00;
    hr = -0x7ff5fc09;
    pbStack_40 = pbVar2;
    OVar11 = local_32[0];
LAB_00d571c7:
    local_32[0] = OVar11;
    *(byte **)(this + 0x4e0) = pbStack_40 + -1;
    Scanner<UTF8EncodingPolicyBase<false>_>::Error
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,hr);
  }
  bVar1 = *pbStack_40;
  local_32[0] = (char16)bVar1;
  switch(bVar1) {
  case 0x6e:
    local_32[0] = L'\n';
    ch_00 = L'n';
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
switchD_00d56d74_caseD_6f:
    ch_00 = (ushort)bVar1;
    if (((char)bVar1 < '\0') &&
       (pbStack_40 = pbVar2,
       ch_00 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                         ((UTF8EncodingPolicyBase<false> *)(this + 8),local_32[0],
                          &stack0xffffffffffffffc0,last), pbVar2 = pbStack_40, local_32[0] = ch_00,
       (ch_00 & 0xfffeU) == 0x2028)) goto LAB_00d56e4a;
    break;
  case 0x72:
    local_32[0] = L'\r';
    ch_00 = L'r';
    break;
  case 0x74:
    local_32[0] = L'\t';
    ch_00 = L't';
    break;
  case 0x75:
    pbStack_40 = pbVar2;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x75);
    local_32[0] = L'\0';
    if (pbStack_40 < last) {
      cVar9 = (char16)*pbStack_40;
    }
    else {
      cVar9 = L'\0';
    }
    pbStack_40 = pbStack_40 + 1;
    BVar5 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_44);
    if (BVar5 != 0) {
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                (this_00,(uint)(ushort)cVar9);
      uVar10 = local_44;
      if (pbStack_40 < last) {
        cVar9 = (char16)*pbStack_40;
      }
      else {
        cVar9 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar5 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_44);
      if (BVar5 != 0) {
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                  (this_00,(uint)(ushort)cVar9);
        iVar6 = local_44 * 0x100 + uVar10 * 0x1000;
        goto LAB_00d56f37;
      }
      goto LAB_00d571c1;
    }
    hr = -0x7ff5fc01;
    OVar11 = local_32[0];
    if ((cVar9 != L'{') || (this[0x509] != (Scanner<UTF8EncodingPolicyBase<false>>)0x1))
    goto LAB_00d571c7;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x7b);
    if (pbStack_40 < last) {
      cVar9 = (char16)*pbStack_40;
    }
    else {
      cVar9 = L'\0';
    }
    pbStack_40 = pbStack_40 + 1;
    BVar5 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_44);
    hr = -0x7ff5fc01;
    OVar11 = local_32[0];
    if (BVar5 == 0) goto LAB_00d571c7;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
              (this_00,(uint)(ushort)cVar9);
    uVar10 = local_44;
    while( true ) {
      if (pbStack_40 < last) {
        ch_01 = (uint)*pbStack_40;
      }
      else {
        ch_01 = 0;
      }
      pbStack_40 = pbStack_40 + 1;
      BVar5 = Js::NumberUtilities::FHexDigit((char16)ch_01,(int *)&local_44);
      if (BVar5 == 0) break;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,ch_01);
      uVar10 = uVar10 * 0x10 + local_44;
      if (0x10ffff < uVar10) {
        hr = -0x7ff5fbd9;
        OVar11 = local_32[0];
        goto LAB_00d571c7;
      }
    }
    if ((char16)ch_01 != L'}') {
      hr = -0x7ff5fbd8;
      OVar11 = local_32[0];
      goto LAB_00d571c7;
    }
    if (uVar10 < 0x110000) {
      if (0xffff < uVar10) goto LAB_00d570af;
      local_32[0] = (char16)uVar10;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                          ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
      if (!bVar12) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
LAB_00d570af:
      local_46 = L'\0';
      Js::NumberUtilities::CodePointAsSurrogatePair(uVar10,&local_46,local_32);
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_46);
    }
    ch_00 = L'}';
    pbVar2 = pbStack_40;
    break;
  case 0x76:
    local_32[0] = L'\v';
    ch_00 = L'v';
    break;
  case 0x78:
    pbStack_40 = pbVar2;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(this_00,0x78);
    local_32[0] = L'\0';
    iVar6 = 0;
LAB_00d56f37:
    if (pbStack_40 < last) {
      cVar9 = (char16)*pbStack_40;
    }
    else {
      cVar9 = L'\0';
    }
    pbStack_40 = pbStack_40 + 1;
    BVar5 = Js::NumberUtilities::FHexDigit(cVar9,(int *)&local_44);
    if (BVar5 != 0) {
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                (this_00,(uint)(ushort)cVar9);
      uVar10 = local_44;
      if (pbStack_40 < last) {
        ch_00 = (OLECHAR)*pbStack_40;
      }
      else {
        ch_00 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar5 = Js::NumberUtilities::FHexDigit(ch_00,(int *)&local_44);
      if (BVar5 != 0) {
        uVar10 = uVar10 * 0x10 + iVar6 + local_44;
        hr = -0x7ff5fc01;
        OVar11 = local_32[0];
        if (uVar10 < 0x10000) {
          local_32[0] = (char16)uVar10;
          pbVar2 = pbStack_40;
          break;
        }
        goto LAB_00d571c7;
      }
    }
LAB_00d571c1:
    hr = -0x7ff5fc01;
    OVar11 = local_32[0];
    goto LAB_00d571c7;
  default:
    hr = -0x7ff5fbf1;
    if (bVar1 - 0x30 < 4) {
      OVar11 = local_32[0] + L'￐';
      if (pbVar2 < last) {
        bVar12 = (*pbVar2 & 0xf8) == 0x30;
      }
      else {
        bVar12 = false;
      }
      pbStack_40 = pbVar2;
      if (OVar11 == L'\0') {
        ch_00 = L'0';
        local_32[0] = L'\0';
        if (!bVar12) break;
      }
      goto LAB_00d571c7;
    }
    if (bVar1 == 0) goto LAB_00d56d53;
    ch_00 = L'\n';
    uVar10 = (uint)bVar1;
    if (uVar10 == 10) goto LAB_00d56e4a;
    if (uVar10 == 0xd) {
      if ((pbVar2 < last) && (*pbVar2 == 10)) {
        pbVar2 = pbStack_40 + 2;
      }
LAB_00d56e4a:
      pbStack_40 = pbVar2;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                (this_00,(uint)(ushort)ch_00);
      Scanner<UTF8EncodingPolicyBase<false>_>::NotifyScannedNewLine
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this);
      *(byte **)(this + 0x4d0) = pbStack_40;
      goto LAB_00d56b7c;
    }
    if (uVar10 == 0x62) {
      local_32[0] = L'\b';
      ch_00 = L'b';
      break;
    }
    if (uVar10 != 0x66) {
      pbStack_40 = pbVar2;
      OVar11 = local_32[0];
      if (3 < uVar10 - 0x34) goto switchD_00d56d74_caseD_6f;
      goto LAB_00d571c7;
    }
    local_32[0] = L'\f';
    ch_00 = L'f';
  }
LAB_00d56c00:
  pbStack_40 = pbVar2;
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_32[0]);
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
            (this_00,(uint)(ushort)ch_00);
  goto LAB_00d56b7c;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}